

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsConvTest(SUNNonlinearSolver NLS,N_Vector y,N_Vector del,realtype tol,N_Vector ewt,
                       void *arkode_mem)

{
  int iVar1;
  double in_XMM0_Qa;
  realtype rVar2;
  double dVar3;
  int retval;
  int m;
  realtype dcon;
  realtype delnrm;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffff88;
  N_Vector in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  undefined4 local_5c;
  undefined8 local_48;
  undefined4 local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                       (ARKodeMem *)in_stack_ffffffffffffff88,(ARKodeMRIStepMem *)0x118508e);
  if (local_4 == 0) {
    if (*(int *)(local_48 + 0x10) == 0) {
      rVar2 = N_VWrmsNorm(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      iVar1 = SUNNonlinSolGetCurIter((SUNNonlinearSolver)in_stack_ffffffffffffff88,(int *)0x11850e2)
      ;
      if (iVar1 == 0) {
        if (0 < local_5c) {
          if (*(double *)(local_48 + 0xd0) * *(double *)(local_48 + 0xe0) <=
              rVar2 / *(double *)(local_48 + 0xe8)) {
            dVar3 = rVar2 / *(double *)(local_48 + 0xe8);
          }
          else {
            dVar3 = *(double *)(local_48 + 0xd0) * *(double *)(local_48 + 0xe0);
          }
          *(double *)(local_48 + 0xe0) = dVar3;
        }
        if (1.0 < *(double *)(local_48 + 0xe0) || *(double *)(local_48 + 0xe0) == 1.0) {
          dVar3 = 1.0;
        }
        else {
          dVar3 = *(double *)(local_48 + 0xe0);
        }
        if (1.0 < (dVar3 * rVar2) / in_XMM0_Qa) {
          if ((local_5c < 1) ||
             (rVar2 <= *(double *)(local_48 + 0xd8) * *(double *)(local_48 + 0xe8))) {
            *(realtype *)(local_48 + 0xe8) = rVar2;
            local_4 = 0x385;
          }
          else {
            local_4 = 0x386;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = -0x15;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsConvTest(SUNNonlinearSolver NLS, N_Vector y, N_Vector del,
                        realtype tol, N_Vector ewt, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  realtype delnrm, dcon;
  int m, retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_NlsConvTest",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if the problem is linearly implicit, just return success */
  if (step_mem->linear)
    return(SUN_NLS_SUCCESS);

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != ARK_SUCCESS)  return(ARK_MEM_NULL);

  /* update the stored estimate of the convergence rate (assumes linear convergence) */
  if (m > 0)
    step_mem->crate = SUNMAX(step_mem->crdown*step_mem->crate, delnrm/step_mem->delp);

  /* compute our scaled error norm for testing convergence */
  dcon = SUNMIN(step_mem->crate, ONE) * delnrm / tol;

  /* check for convergence; if so return with success */
  if (dcon <= ONE)  return(SUN_NLS_SUCCESS);

  /* check for divergence */
  if ((m >= 1) && (delnrm > step_mem->rdiv*step_mem->delp))
    return(SUN_NLS_CONV_RECVR);

  /* save norm of correction for next iteration */
  step_mem->delp = delnrm;

  /* return with flag that there is more work to do */
  return(SUN_NLS_CONTINUE);
}